

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O2

duckdb_state
duckdb_arrow_scan(duckdb_connection connection,char *table_name,duckdb_arrow_stream arrow)

{
  ArrowSchema *pAVar1;
  int iVar2;
  unsigned_long uVar3;
  Relation *name;
  duckdb_state dVar4;
  long lVar5;
  idx_t i;
  ulong uVar6;
  idx_t i_1;
  initializer_list<duckdb::Value> __l;
  allocator local_1c3;
  allocator_type local_1c2;
  allocator local_1c1;
  undefined1 local_1c0 [16];
  vector<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_> release_fns;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_198 [24];
  string local_180 [32];
  vector<duckdb::Value,_true> local_160;
  undefined1 local_140 [16];
  ArrowSchema schema;
  Value local_e8 [3];
  
  iVar2 = (**(code **)arrow)(arrow,&schema);
  if (iVar2 == 1) {
    dVar4 = DuckDBError;
  }
  else {
    uVar3 = duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(schema.n_children);
    std::vector<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_>::vector
              (&release_fns,uVar3,(allocator_type *)local_e8);
    uVar6 = 0;
    while( true ) {
      uVar3 = duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(schema.n_children);
      if (uVar3 <= uVar6) break;
      pAVar1 = schema.children[uVar6];
      release_fns.
      super__Vector_base<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = pAVar1->release;
      pAVar1->release = arrow_array_stream_wrapper::anon_unknown_0::EmptySchemaRelease;
      uVar6 = uVar6 + 1;
    }
    std::__cxx11::string::string((string *)&local_160,"arrow_scan",&local_1c1);
    duckdb::Value::POINTER(local_e8,(uintptr_t)arrow);
    duckdb::Value::POINTER(local_e8 + 1,0xa104d3);
    duckdb::Value::POINTER(local_e8 + 2,0xa10534);
    __l._M_len = 3;
    __l._M_array = local_e8;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(local_198,__l,&local_1c2);
    duckdb::Connection::TableFunction((Connection *)local_1c0,(string *)connection,&local_160);
    name = duckdb::shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)local_1c0);
    std::__cxx11::string::string(local_180,table_name,&local_1c3);
    duckdb::Relation::CreateView((Relation *)local_140,(string *)name,SUB81(local_180,0),true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
    std::__cxx11::string::~string(local_180);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8));
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_198);
    lVar5 = 0x80;
    do {
      duckdb::Value::~Value((Value *)(&local_e8[0].type_.id_ + lVar5));
      lVar5 = lVar5 + -0x40;
    } while (lVar5 != -0x40);
    std::__cxx11::string::~string((string *)&local_160);
    dVar4 = DuckDBSuccess;
    uVar6 = 0;
    while( true ) {
      uVar3 = duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(schema.n_children);
      if (uVar3 <= uVar6) break;
      schema.children[uVar6]->release =
           release_fns.
           super__Vector_base<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    }
    std::_Vector_base<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_>::
    ~_Vector_base(&release_fns.
                   super__Vector_base<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_>
                 );
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_arrow_scan(duckdb_connection connection, const char *table_name, duckdb_arrow_stream arrow) {
	auto stream = reinterpret_cast<ArrowArrayStream *>(arrow);

	// Backup release functions - we nullify children schema release functions because we don't want to release on
	// behalf of the caller, downstream in our code. Note that Arrow releases target immediate children, but aren't
	// recursive. So we only back up immediate children here and restore their functions.
	ArrowSchema schema;
	if (stream->get_schema(stream, &schema) == DuckDBError) {
		return DuckDBError;
	}

	typedef void (*release_fn_t)(ArrowSchema *);
	std::vector<release_fn_t> release_fns(duckdb::NumericCast<idx_t>(schema.n_children));
	for (idx_t i = 0; i < duckdb::NumericCast<idx_t>(schema.n_children); i++) {
		auto child = schema.children[i];
		release_fns[i] = child->release;
		child->release = arrow_array_stream_wrapper::EmptySchemaRelease;
	}

	auto ret = arrow_array_stream_wrapper::Ingest(connection, table_name, stream);

	// Restore release functions.
	for (idx_t i = 0; i < duckdb::NumericCast<idx_t>(schema.n_children); i++) {
		schema.children[i]->release = release_fns[i];
	}

	return ret;
}